

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::CheckValue(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  bool local_39;
  bool local_25;
  const_iterator cStack_20;
  SymbolType type;
  Parser *local_18;
  Parser *this_local;
  
  local_25 = true;
  local_18 = this;
  if ((this->m_error & 1U) == 0) {
    cStack_20 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    local_25 = __gnu_cxx::operator==(&this->m_currentSymbol,&stack0xffffffffffffffe0);
  }
  if (local_25 == false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    SVar1 = pSVar2->type;
    local_39 = true;
    if ((((SVar1 != NumberValue) && (local_39 = true, SVar1 != IntegerValue)) &&
        (local_39 = true, SVar1 != BooleanValue)) && (local_39 = true, SVar1 != StringValue)) {
      local_39 = SVar1 == Null;
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool Parser::CheckValue() const
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return false;
		auto type = m_currentSymbol->type;
		return
			type == SymbolType::NumberValue ||
			type == SymbolType::IntegerValue ||
			type == SymbolType::BooleanValue ||
			type == SymbolType::StringValue ||
			type == SymbolType::Null;
	}